

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonschema::
ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
ref_validator(ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *schema,
             uri *schema_location,
             schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *referred_schema,string *custom_message)

{
  undefined8 in_RCX;
  undefined8 *in_RDI;
  string *custom_message_00;
  uri *in_stack_ffffffffffffffa0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  allocator<char> *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  validator_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  validator_base((validator_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)(in_RDI + 0x1d));
  ref<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::ref
            ((ref<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *)
             (in_RDI + 0x1e));
  custom_message_00 = (string *)&stack0xffffffffffffffb7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  keyword_validator((keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                    ,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,custom_message_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  *in_RDI = 0x1349ce8;
  in_RDI[0x1d] = 0x1349d78;
  in_RDI[0x1e] = 0x1349dd0;
  in_RDI[0x1c] = in_RCX;
  return;
}

Assistant:

ref_validator(const Json& schema, const uri& schema_location, const schema_validator<Json>* referred_schema, 
            const std::string& custom_message = std::string{})
            : keyword_validator<Json>("$ref", schema, schema_location, custom_message), referred_schema_(referred_schema)
        {
            //std::cout << "ref_validator2: " << this->schema_location().string() << "\n";
        }